

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  float fVar2;
  char cVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiCol idx;
  bool bVar6;
  ImU32 IVar7;
  uint uVar8;
  char *pcVar9;
  ImGuiTableColumn *pIVar10;
  int order_n;
  ulong uVar11;
  ImDrawList *this;
  ImGuiWindow *pIVar12;
  ImGuiWindow *pIVar13;
  float fVar14;
  ImVec2 local_88;
  float local_7c;
  ImVec2 local_78;
  ImVec2 aIStack_70 [2];
  float local_5c;
  ImDrawList *local_58;
  ImGuiWindow *local_50;
  ImGuiWindow *local_48;
  ImDrawList *local_40;
  ImSpan<signed_char> *local_38;
  
  pIVar12 = table->OuterWindow;
  pIVar13 = table->InnerWindow;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar13->DrawList,0);
  if (pIVar13->Hidden != false) {
    return;
  }
  bVar6 = ImRect::Overlaps(&table->HostClipRect,&table->InnerClipRect);
  if (!bVar6) {
    return;
  }
  local_7c = (table->OuterRect).Min.y;
  fVar14 = local_7c;
  if (table->IsUsingHeaders == true) {
    if (table->FreezeRowsCount < '\x01') {
      fVar14 = (table->WorkRect).Min.y;
    }
    fVar14 = fVar14 + table->LastFirstRowHeight;
  }
  local_58 = pIVar13->DrawList;
  uVar8 = table->Flags;
  this = pIVar12->DrawList;
  if ((uVar8 >> 10 & 1) != 0) {
    fVar2 = (table->OuterRect).Max.y;
    local_38 = &table->DisplayOrderToIndex;
    local_5c = fVar14;
    local_50 = pIVar13;
    local_48 = pIVar12;
    local_40 = pIVar12->DrawList;
    for (uVar11 = 0; (long)uVar11 < (long)table->ColumnsCount; uVar11 = uVar11 + 1) {
      if ((table->VisibleMaskByDisplayOrder >> (uVar11 & 0x3f) & 1) != 0) {
        pcVar9 = ImSpan<signed_char>::operator[](local_38,(int)uVar11);
        cVar3 = *pcVar9;
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)cVar3);
        if (table->ResizedColumn == cVar3) {
          bVar6 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar6 = false;
        }
        fVar14 = pIVar10->MaxX;
        pIVar1 = &(table->InnerClipRect).Max;
        if ((((bool)((fVar14 < pIVar1->x || fVar14 == pIVar1->x) | bVar6)) &&
            (pIVar10->NextVisibleColumn != -1 || (pIVar10->Flags & 0x40000020U) == 0)) &&
           ((pIVar10->ClipRect).Min.x < fVar14)) {
          fVar14 = fVar2;
          if ((table->HoveredColumnBorder == cVar3 || bVar6) ||
             ((table->FreezeColumnsCount != -1 &&
              (uVar11 + 1 == (ulong)(uint)(int)table->FreezeColumnsCount)))) {
            if (bVar6) {
              idx = 0x1d;
            }
            else {
              if (table->HoveredColumnBorder != cVar3) {
                IVar7 = table->BorderColorStrong;
                goto LAB_002d6b74;
              }
              idx = 0x1c;
            }
            IVar7 = GetColorU32(idx,1.0);
          }
          else {
            bVar6 = (table->Flags & 0x3000) == 0;
            if (!bVar6) {
              fVar14 = local_5c;
            }
            IVar7 = table->RowBgColor[(ulong)bVar6 + 2];
          }
LAB_002d6b74:
          if (local_7c < fVar14) {
            local_78.x = pIVar10->MaxX;
            local_78.y = local_7c;
            local_88.y = fVar14;
            local_88.x = local_78.x;
            ImDrawList::AddLine(local_58,&local_78,&local_88,IVar7,1.0);
          }
        }
      }
    }
    uVar8 = table->Flags;
    this = local_40;
    pIVar12 = local_48;
    pIVar13 = local_50;
  }
  if ((uVar8 & 0xa00) == 0) goto LAB_002d6d09;
  IVar4 = (table->OuterRect).Min;
  IVar5 = (table->OuterRect).Max;
  local_78.x = IVar4.x;
  local_78.y = IVar4.y;
  aIStack_70[0].x = IVar5.x;
  aIStack_70[0].y = IVar5.y;
  if (pIVar13 != pIVar12) {
    local_78.x = local_78.x + -1.0;
    local_78.y = local_78.y + -1.0;
    aIStack_70[0].x = aIStack_70[0].x + 1.0;
    aIStack_70[0].y = aIStack_70[0].y + 1.0;
  }
  IVar7 = table->BorderColorStrong;
  if ((uVar8 & 0xa00) == 0xa00) {
    ImDrawList::AddRect(this,&local_78,aIStack_70,IVar7,0.0,-1,1.0);
  }
  else {
    if ((uVar8 >> 0xb & 1) == 0) {
      if ((uVar8 >> 9 & 1) == 0) goto LAB_002d6d06;
      local_88.y = local_78.y;
      local_88.x = aIStack_70[0].x;
      ImDrawList::AddLine(this,&local_78,&local_88,IVar7,1.0);
      local_88.y = aIStack_70[0].y;
      local_88.x = local_78.x;
    }
    else {
      local_88.y = aIStack_70[0].y;
      local_88.x = local_78.x;
      ImDrawList::AddLine(this,&local_78,&local_88,IVar7,1.0);
      local_88.y = local_78.y;
      local_88.x = aIStack_70[0].x;
    }
    ImDrawList::AddLine(this,&local_88,aIStack_70,IVar7,1.0);
  }
LAB_002d6d06:
  uVar8 = table->Flags;
LAB_002d6d09:
  if ((((uVar8 >> 8 & 1) != 0) &&
      (local_78.y = table->RowPosY2, local_78.y < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= local_78.y && (local_78.y < (table->BgClipRect).Max.y)))) {
    local_78.x = table->BorderX1;
    local_88.y = local_78.y;
    local_88.x = table->BorderX2;
    ImDrawList::AddLine(local_58,&local_78,&local_88,table->BorderColorLight,1.0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_BG0);
    if (inner_window->Hidden || !table->HostClipRect.Overlaps(table->InnerClipRect))
        return;
    ImDrawList* inner_drawlist = inner_window->DrawList;
    ImDrawList* outer_drawlist = outer_window->DrawList;

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->OuterRect.Min.y;
    const float draw_y2_body = table->OuterRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ((table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;

    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;

            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)// && is_hovered)
                continue;
            if (column->NextVisibleColumn == -1 && !is_resizable)
                continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1))
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME-TABLE: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if (inner_window != outer_window) // FIXME-TABLE
            outer_border.Expand(1.0f);
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            outer_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }
}